

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall kj::_::Debug::Context::onRecoverableException(Context *this,Exception *exception)

{
  ExceptionCallback *pEVar1;
  Value v;
  Value local_40;
  
  ensureInitialized(&local_40,this);
  Exception::wrapContext(exception,local_40.file,local_40.line,&local_40.description);
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,exception);
  Array<char>::~Array(&local_40.description.content);
  return;
}

Assistant:

void Debug::Context::onRecoverableException(Exception&& exception) {
  Value v = ensureInitialized();
  exception.wrapContext(v.file, v.line, mv(v.description));
  next.onRecoverableException(kj::mv(exception));
}